

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFileListGeneratorCaseInsensitive::Search
          (cmFileListGeneratorCaseInsensitive *this,string *parent,cmFileList *lister)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *lhs;
  ulong dindex;
  Directory d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  Directory local_80;
  cmFileList *local_78;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = lister;
  cmsys::Directory::Directory(&local_80);
  local_70 = parent;
  cmsys::Directory::Load(&local_80,parent);
  dindex = 0;
  while( true ) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_80);
    if (uVar3 <= dindex) break;
    lhs = cmsys::Directory::GetFile(&local_80,dindex);
    if ((*lhs != '.') || ((lhs[1] != '\0' && ((lhs[1] != '.' || (lhs[2] != '\0')))))) {
      iVar2 = cmsysString_strcasecmp(lhs,(this->String)._M_dataplus._M_p);
      if (iVar2 == 0) {
        std::operator+(&local_50,local_70,lhs);
        bVar1 = cmFileListGeneratorBase::Consider
                          (&this->super_cmFileListGeneratorBase,&local_50,local_78);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) break;
      }
    }
    dindex = dindex + 1;
  }
  cmsys::Directory::~Directory(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return dindex < uVar3;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) CM_OVERRIDE
  {
    // Look for matching files.
    std::vector<std::string> matches;
    cmsys::Directory d;
    d.Load(parent);
    for (unsigned long i = 0; i < d.GetNumberOfFiles(); ++i) {
      const char* fname = d.GetFile(i);
      if (strcmp(fname, ".") == 0 || strcmp(fname, "..") == 0) {
        continue;
      }
      if (cmsysString_strcasecmp(fname, this->String.c_str()) == 0) {
        if (this->Consider(parent + fname, lister)) {
          return true;
        }
      }
    }
    return false;
  }